

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O0

void __thiscall QTest::WatchDog::run(WatchDog *this)

{
  bool bVar1;
  WatchDog *this_00;
  char *file;
  undefined8 uVar2;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  Expectation e;
  unique_lock<std::mutex> locker;
  mutex *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffa8;
  memory_order in_stack_ffffffffffffffac;
  unique_lock<std::mutex> *in_stack_ffffffffffffffb0;
  char local_38 [32];
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CrashHandler::blockUnixSignals();
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  (anonymous_namespace)::qt_unique_lock<std::mutex,std::unique_lock<std::mutex>>
            (in_stack_ffffffffffffff88);
  std::atomic<QTest::WatchDog::Expectation>::store
            ((atomic<QTest::WatchDog::Expectation> *)&in_RDI[3].context.file,TestFunctionStart,
             memory_order_release);
  std::condition_variable::notify_all();
  do {
    while( true ) {
      this_00 = (WatchDog *)
                std::atomic<QTest::WatchDog::Expectation>::load
                          ((atomic<QTest::WatchDog::Expectation> *)in_stack_ffffffffffffffb0,
                           in_stack_ffffffffffffffac);
      file = (char *)state((Expectation)this_00);
      if ((file != (char *)0x0) && ((char *)0x1 < file + -1)) break;
      bVar1 = waitFor(this_00,in_stack_ffffffffffffffb0,
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      in_stack_ffffffffffffff94 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff94);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        fflush(_stderr);
        CrashHandler::printTestRunTime();
        CrashHandler::generateStackTrace();
        QMessageLogger::QMessageLogger
                  (in_RDI,file,in_stack_ffffffffffffff94,(char *)in_stack_ffffffffffffff88);
        uVar2 = QMessageLogger::fatal(local_38,"Test function timed out");
        std::unique_lock<std::mutex>::~unique_lock
                  ((unique_lock<std::mutex> *)
                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          _Unwind_Resume(uVar2);
        }
LAB_00160900:
        __stack_chk_fail();
      }
    }
  } while (file != (char *)0x3);
  std::unique_lock<std::mutex>::~unique_lock
            ((unique_lock<std::mutex> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  goto LAB_00160900;
}

Assistant:

void run() override
    {
        CrashHandler::blockUnixSignals();
        auto locker = qt_unique_lock(mutex);
        expecting.store(TestFunctionStart, std::memory_order_release);
        waitCondition.notify_all();
        while (true) {
            Expectation e = expecting.load(std::memory_order_acquire);
            switch (state(e)) {
            case ThreadEnd:
                return;
            case ThreadStart:
                Q_UNREACHABLE();
            case TestFunctionStart:
            case TestFunctionEnd:
                if (Q_UNLIKELY(!waitFor(locker, e))) {
                    std::fflush(stderr);
                    CrashHandler::printTestRunTime();
                    CrashHandler::generateStackTrace();
                    qFatal("Test function timed out");
                }
            }
        }
    }